

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
insert<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table,size_t pos,
          StringPtr *params)

{
  size_t *psVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  RawSchema **ppRVar8;
  HashBucket *s;
  RawSchema **ppRVar9;
  Entry *this_00;
  ulong targetSize;
  StringPtr *in_R9;
  size_t sVar10;
  Maybe<unsigned_long> MVar11;
  
  this_00 = table.ptr;
  uVar3 = *(size_t *)&(this_00->value).index * 2;
  if (uVar3 < ((this_00->key).content.size_ + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar3) {
      targetSize = uVar3;
    }
    HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>::rehash
              ((HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks> *)
               this_00,targetSize);
  }
  uVar5 = hashCode<kj::StringPtr&>(in_R9);
  uVar6 = kj::_::chooseBucket((uint)(uVar5 != 0),(uint)*(size_t *)&(this_00->value).index);
  ppRVar9 = (RawSchema **)0x0;
  aVar7 = extraout_RDX;
  do {
    ppRVar8 = &((this_00->value).parent.super_Schema.raw)->generic + uVar6;
    uVar2 = *(uint *)((long)ppRVar8 + 4);
    if (uVar2 == 1) {
      if (ppRVar9 == (RawSchema **)0x0) {
        ppRVar9 = ppRVar8;
      }
    }
    else {
      if (uVar2 == 0) {
        if (ppRVar9 != (RawSchema **)0x0) {
          psVar1 = &(this_00->key).content.size_;
          *psVar1 = *psVar1 - 1;
          ppRVar8 = ppRVar9;
        }
        *ppRVar8 = (RawSchema *)(((ulong)(uVar5 != 0) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
        goto LAB_00231556;
      }
      if (*(uint *)ppRVar8 == (uint)(uVar5 != 0)) {
        bVar4 = StringPtr::operator==((StringPtr *)((ulong)(uVar2 - 2) * 0x50 + table.size_),in_R9);
        aVar7 = extraout_RDX_00;
        if (bVar4) {
          uVar5 = *(uint *)((long)ppRVar8 + 4);
          *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x1;
          *(ulong *)(this + 8) = (ulong)(uVar5 - 2);
LAB_00231556:
          MVar11.ptr.field_1.value = aVar7.value;
          MVar11.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar11.ptr;
        }
      }
    }
    sVar10 = (ulong)uVar6 + 1;
    uVar6 = 0;
    if (sVar10 != *(size_t *)&(this_00->value).index) {
      uVar6 = (uint)sVar10;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }